

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

optional<kernel::CCoinsStats> *
kernel::ComputeUTXOStats
          (CoinStatsHashType hash_type,CCoinsView *view,BlockManager *blockman,
          function<void_()> *interruption_point)

{
  long lVar1;
  bool bVar2;
  CBlockIndex **ppCVar3;
  char *in_RCX;
  CCoinsStats *in_RDI;
  CCoinsStats *in_R8;
  long in_FS_OFFSET;
  bool success;
  CBlockIndex *pindex;
  CCoinsStats stats;
  anon_class_32_4_8c276940 *in_stack_000001d0;
  CCoinsStats *__t;
  int iVar4;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffec0;
  anon_class_16_2_e0ddf2b1 *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  CBlockIndex **in_stack_fffffffffffffed8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __t = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_RDI);
  ComputeUTXOStats::anon_class_16_2_e0ddf2b1::operator()(in_stack_fffffffffffffec8);
  ppCVar3 = inline_assertion_check<true,CBlockIndex*&>
                      (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),in_stack_fffffffffffffec0,
                       in_RCX);
  iVar4 = (*ppCVar3)->nHeight;
  CBlockIndex::GetBlockHash((CBlockIndex *)CONCAT44(in_stack_fffffffffffffeac,iVar4));
  CCoinsStats::CCoinsStats(in_R8,in_stack_fffffffffffffeac,(uint256 *)__t);
  bVar2 = ComputeUTXOStats::anon_class_32_4_8c276940::operator()(in_stack_000001d0);
  if (bVar2) {
    std::optional<kernel::CCoinsStats>::optional<kernel::CCoinsStats,_true>
              ((optional<kernel::CCoinsStats> *)
               CONCAT44(CONCAT13(bVar2,(int3)in_stack_fffffffffffffeac),iVar4),__t);
  }
  else {
    std::optional<kernel::CCoinsStats>::optional((optional<kernel::CCoinsStats> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<kernel::CCoinsStats> *)__t;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CCoinsStats> ComputeUTXOStats(CoinStatsHashType hash_type, CCoinsView* view, node::BlockManager& blockman, const std::function<void()>& interruption_point)
{
    CBlockIndex* pindex = WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()));
    CCoinsStats stats{Assert(pindex)->nHeight, pindex->GetBlockHash()};

    bool success = [&]() -> bool {
        switch (hash_type) {
        case(CoinStatsHashType::HASH_SERIALIZED): {
            HashWriter ss{};
            return ComputeUTXOStats(view, stats, ss, interruption_point);
        }
        case(CoinStatsHashType::MUHASH): {
            MuHash3072 muhash;
            return ComputeUTXOStats(view, stats, muhash, interruption_point);
        }
        case(CoinStatsHashType::NONE): {
            return ComputeUTXOStats(view, stats, nullptr, interruption_point);
        }
        } // no default case, so the compiler can warn about missing cases
        assert(false);
    }();

    if (!success) {
        return std::nullopt;
    }
    return stats;
}